

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_buffers.cc
# Opt level: O0

void __thiscall deflate_small_buffers_Test::TestBody(deflate_small_buffers_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char *pcVar4;
  AssertHelper *this_00;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int err;
  size_t uncompr_len;
  size_t compr_len;
  uint8_t uncompr [128];
  uint8_t compr [128];
  zng_stream d_stream;
  zng_stream c_stream;
  undefined4 in_stack_fffffffffffffbd8;
  int32_t in_stack_fffffffffffffbdc;
  zng_stream *in_stack_fffffffffffffbe0;
  int *in_stack_fffffffffffffbe8;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf7;
  char *in_stack_fffffffffffffbf8;
  int line;
  char *in_stack_fffffffffffffc00;
  AssertionResult *this_02;
  Type in_stack_fffffffffffffc0c;
  Type type;
  AssertHelper *in_stack_fffffffffffffc10;
  int32_t in_stack_fffffffffffffc24;
  zng_stream *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  AssertionResult *this_03;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  AssertHelper *in_stack_fffffffffffffc60;
  undefined8 uVar5;
  zng_stream *strm;
  AssertionResult local_338 [2];
  undefined4 local_314;
  AssertionResult local_310 [2];
  undefined4 local_2ec;
  AssertionResult local_2e8 [2];
  undefined4 local_2c4;
  AssertionResult local_2c0 [2];
  undefined4 local_29c;
  AssertionResult local_298 [2];
  undefined4 local_274;
  AssertionResult local_270 [2];
  undefined4 local_24c;
  AssertionResult local_248 [3];
  undefined4 local_214;
  zng_stream local_210;
  undefined1 local_168 [128];
  undefined1 *local_e8;
  undefined8 uStack_e0;
  ulong local_d8;
  size_t *psStack_d0;
  undefined8 local_c8;
  uint8_t *puStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  char *local_78;
  undefined8 uStack_70;
  long local_68;
  undefined1 *puStack_60;
  undefined8 local_58;
  ulong uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_210._32_8_ = 0x80;
  local_210.next_out = (uint8_t *)0x80;
  uVar5 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  puStack_60 = (undefined1 *)0x0;
  local_78 = (char *)0x0;
  uStack_70 = 0;
  local_18 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  puStack_c0 = (uint8_t *)0x0;
  local_d8 = 0;
  psStack_d0 = (size_t *)0x0;
  local_e8 = (undefined1 *)0x0;
  uStack_e0 = 0;
  local_88 = 0;
  local_210.total_in._4_4_ = zng_deflateInit(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
  local_214 = 0;
  strm = &local_210;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffbf8,
             (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
             in_stack_fffffffffffffbe8,(int *)in_stack_fffffffffffffbe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)strm);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc10);
    testing::AssertionResult::failure_message((AssertionResult *)0x13956e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,in_stack_fffffffffffffc00,
               (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc60,
               (Message *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
    testing::Message::~Message((Message *)0x1395d1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x139629);
  local_78 = "hello, hello!";
  puStack_60 = local_168;
  while (local_68 != 0xe && uStack_50 < (ulong)local_210._32_8_) {
    local_58 = CONCAT44(local_58._4_4_,1);
    uStack_70 = CONCAT44(uStack_70._4_4_,1);
    local_210.total_in._4_4_ = zng_deflate(in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
    local_24c = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffbf8,
               (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               in_stack_fffffffffffffbe8,(int *)in_stack_fffffffffffffbe0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_248);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc10);
      testing::AssertionResult::failure_message((AssertionResult *)0x13975f);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,in_stack_fffffffffffffc00,
                 (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc60,
                 (Message *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
      testing::Message::~Message((Message *)0x1397c2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x139817);
  }
  while( true ) {
    local_58 = CONCAT44(local_58._4_4_,1);
    local_210.total_in._4_4_ = zng_deflate(in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
    if (local_210.total_in._4_4_ == 1) break;
    local_274 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffbf8,
               (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               in_stack_fffffffffffffbe8,(int *)in_stack_fffffffffffffbe0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_270);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc10);
      in_stack_fffffffffffffc60 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1398fe);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,in_stack_fffffffffffffc00,
                 (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc60,
                 (Message *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
      testing::Message::~Message((Message *)0x139961);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1399b6);
  }
  local_210.total_in._4_4_ =
       zng_deflateEnd((zng_stream *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  local_29c = 0;
  this_03 = local_298;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffbf8,
             (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
             in_stack_fffffffffffffbe8,(int *)in_stack_fffffffffffffbe0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_03);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc10);
    in_stack_fffffffffffffc48 =
         testing::AssertionResult::failure_message((AssertionResult *)0x139a76);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,in_stack_fffffffffffffc00,
               (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc60,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffc58));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
    testing::Message::~Message((Message *)0x139ad3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x139b2b);
  strcpy((char *)&local_210.total_out,"garbage");
  local_e8 = local_168;
  psStack_d0 = &local_210.total_out;
  local_210.total_in._4_4_ = zng_inflateInit((zng_stream *)0x139b6e);
  local_2c4 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffbf8,
             (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
             in_stack_fffffffffffffbe8,(int *)in_stack_fffffffffffffbe0);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_2c0);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc10);
    testing::AssertionResult::failure_message((AssertionResult *)0x139c16);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,in_stack_fffffffffffffc00,
               (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc60,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffc58));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
    testing::Message::~Message((Message *)0x139c73);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x139ccb);
  while (puStack_c0 < local_210.next_out && local_d8 < (ulong)local_210._32_8_) {
    local_c8 = CONCAT44(local_c8._4_4_,1);
    uStack_e0 = CONCAT44(uStack_e0._4_4_,1);
    local_210.total_in._4_4_ = zng_inflate(strm,(int32_t)((ulong)uVar5 >> 0x20));
    if (local_210.total_in._4_4_ == 1) break;
    local_2ec = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffbf8,
               (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               in_stack_fffffffffffffbe8,(int *)in_stack_fffffffffffffbe0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2e8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc10);
      in_stack_fffffffffffffc10 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x139de3);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,in_stack_fffffffffffffc00,
                 (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffc60,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffc58));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
      testing::Message::~Message((Message *)0x139e40);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x139e95);
  }
  local_210.total_in._4_4_ =
       zng_inflateEnd((zng_stream *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  local_314 = 0;
  this_02 = local_310;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffbf8,
             (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
             in_stack_fffffffffffffbe8,(int *)in_stack_fffffffffffffbe0);
  line = (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc0c);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc10);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x139f4f);
    line = (int)((ulong)pcVar4 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc10,type,&this_02->success_,line,
               (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc60,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffc58));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
    testing::Message::~Message((Message *)0x139fac);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a001);
  this_01 = local_338;
  testing::internal::CmpHelperSTREQ
            ((char *)CONCAT17(uVar2,in_stack_fffffffffffffc58),&this_03->success_,
             in_stack_fffffffffffffc48,(char *)CONCAT17(uVar3,in_stack_fffffffffffffc40));
  uVar3 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc10);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x13a096)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc10,type,&this_02->success_,line,
               (char *)CONCAT17(uVar3,in_stack_fffffffffffffbf0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffc60,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffc58));
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x13a0f3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a148);
  return;
}

Assistant:

TEST(deflate, small_buffers) {
    PREFIX3(stream) c_stream, d_stream;
    uint8_t compr[128], uncompr[128];
    z_size_t compr_len = sizeof(compr), uncompr_len = sizeof(uncompr);
    int err;

    memset(&c_stream, 0, sizeof(c_stream));
    memset(&d_stream, 0, sizeof(d_stream));

    err = PREFIX(deflateInit)(&c_stream, Z_DEFAULT_COMPRESSION);
    EXPECT_EQ(err, Z_OK);

    c_stream.next_in  = (z_const unsigned char *)hello;
    c_stream.next_out = compr;

    while (c_stream.total_in != hello_len && c_stream.total_out < compr_len) {
        c_stream.avail_in = c_stream.avail_out = 1; /* force small buffers */
        err = PREFIX(deflate)(&c_stream, Z_NO_FLUSH);
        EXPECT_EQ(err, Z_OK);
    }
    /* Finish the stream, still forcing small buffers */
    for (;;) {
        c_stream.avail_out = 1;
        err = PREFIX(deflate)(&c_stream, Z_FINISH);
        if (err == Z_STREAM_END) break;
        EXPECT_EQ(err, Z_OK);
    }

    err = PREFIX(deflateEnd)(&c_stream);
    EXPECT_EQ(err, Z_OK);

    strcpy((char*)uncompr, "garbage");

    d_stream.next_in  = compr;
    d_stream.next_out = uncompr;

    err = PREFIX(inflateInit)(&d_stream);
    EXPECT_EQ(err, Z_OK);

    while (d_stream.total_out < uncompr_len && d_stream.total_in < compr_len) {
        d_stream.avail_in = d_stream.avail_out = 1; /* force small buffers */
        err = PREFIX(inflate)(&d_stream, Z_NO_FLUSH);
        if (err == Z_STREAM_END) break;
        EXPECT_EQ(err, Z_OK);
    }

    err = PREFIX(inflateEnd)(&d_stream);
    EXPECT_EQ(err, Z_OK);

    EXPECT_STREQ((char*)uncompr, hello);
}